

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O2

int ffgmrm(fitsfile *gfptr,long member,int rmopt,int *status)

{
  char cVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  uint uVar7;
  ulong uVar8;
  long member_00;
  fitsfile *mfptr;
  int iomode;
  int hdutype;
  long groupExtver;
  long grpid;
  long ngroups;
  ulong local_1d60;
  char *tgrplc;
  long nmembers;
  char card [81];
  char keyword [75];
  char grpLocation1 [1025];
  char grpLocation3 [1025];
  char grplc [1025];
  char grpLocation2 [1025];
  char cwd [1025];
  char grootname [1025];
  char mrootname [1025];
  
  hdutype = 0;
  iomode = 0;
  ngroups = 0;
  nmembers = 0;
  groupExtver = 0;
  grpid = 0;
  mfptr = (fitsfile *)0x0;
  if (*status != 0) {
    return *status;
  }
  ffflmd(gfptr,&iomode,status);
  if (iomode != 1) {
    ffpmsg("cannot modify grouping table (ffgtam)");
    *status = 0x15e;
    goto LAB_0016759b;
  }
  iVar2 = ffgmop(gfptr,member,&mfptr,status);
  *status = iVar2;
  iVar2 = ffflmd(mfptr,&iomode,status);
  *status = iVar2;
  if (rmopt == 1) {
    if (iomode == 1) {
      iVar2 = ffgkyj(gfptr,"EXTVER",&groupExtver,card,status);
      *status = iVar2;
      ffrtnm(mfptr->Fptr->filename,mrootname,status);
      ffrtnm(gfptr->Fptr->filename,grootname,status);
      if ((mfptr->Fptr != gfptr->Fptr) && (iVar2 = strncmp(mrootname,grootname,0x401), iVar2 != 0))
      {
        groupExtver = -groupExtver;
      }
      iVar2 = fits_get_url(gfptr,grpLocation1,grpLocation2,(char *)0x0,(char *)0x0,(int *)0x0,status
                          );
      *status = iVar2;
      if (iVar2 != 0) goto LAB_0016759b;
      iVar2 = fits_get_cwd(cwd,status);
      *status = iVar2;
      if (((grpLocation1[0] == '\0') || (grpLocation1[0] == '/')) ||
         (iVar2 = fits_is_url_absolute(grpLocation1), iVar2 != 0)) {
LAB_00167087:
        if (((grpLocation2[0] == '\0') || (grpLocation2[0] == '/')) ||
           (iVar2 = fits_is_url_absolute(grpLocation2), iVar2 != 0)) {
LAB_0016725f:
          iVar2 = ffgmng(mfptr,&ngroups,status);
          *status = iVar2;
          iVar2 = ffgrec(mfptr,0,card,status);
          *status = iVar2;
          local_1d60 = ngroups;
          if (ngroups < 1) {
            local_1d60 = 0;
          }
          uVar8 = 0;
LAB_001672a4:
          uVar7 = 0;
LAB_001672a7:
          do {
            if ((local_1d60 == uVar8) || (iVar2 != 0 || uVar7 != 0)) {
              if (uVar7 != 0) {
                snprintf(keyword,0x4b,"GRPID%d",(ulong)uVar7);
                iVar2 = ffdkey(mfptr,keyword,status);
                *status = iVar2;
                snprintf(keyword,0x4b,"GRPLC%d",(ulong)uVar7);
                ffdkey(mfptr,keyword,status);
                *status = 0;
                iVar2 = ffgmng(mfptr,&ngroups,status);
                *status = iVar2;
              }
              goto LAB_00167588;
            }
            uVar8 = uVar8 + 1;
            snprintf(keyword,0x4b,"GRPID%d",uVar8 & 0xffffffff);
            iVar2 = ffgkyj(mfptr,keyword,&grpid,card,status);
            *status = iVar2;
            uVar7 = 0;
          } while (iVar2 != 0);
          if (grpid < 1 || grpid != groupExtver) {
            uVar7 = 0;
            if (-1 < grpid || grpid != groupExtver) {
              iVar2 = 0;
              uVar7 = 0;
              goto LAB_001672a7;
            }
            snprintf(keyword,0x4b,"GRPLC%d",uVar8 & 0xffffffff);
            iVar2 = ffgkls(mfptr,keyword,&tgrplc,card,status);
            pcVar6 = tgrplc;
            *status = iVar2;
            if (iVar2 == 0) {
              strcpy(grplc,tgrplc);
              free(pcVar6);
              iVar2 = *status;
            }
            if (iVar2 != 0) {
              if (iVar2 == 0xca) goto LAB_001674e0;
              goto LAB_001672a7;
            }
            prepare_keyvalue(grplc);
            cVar1 = grplc[0];
            iVar2 = 0;
            if (((grplc[0] != '\0') && (iVar3 = fits_is_url_absolute(grplc), cVar1 != '/')) &&
               (iVar3 == 0)) {
              iVar2 = ffflnm(mfptr,grpLocation3,status);
              *status = iVar2;
              pcVar6 = strrchr(grpLocation3,0x2f);
              if (pcVar6 != (char *)0x0) {
                *pcVar6 = '\0';
              }
              sVar4 = strlen(grpLocation3);
              sVar5 = strlen(grplc);
              if ((sVar5 + sVar4) - 0x400 < 0xfffffffffffffbff) {
                ffpmsg("group locations are too long (ffgmrm)");
                *status = 0x7d;
                iVar2 = 0x7d;
                uVar7 = 0;
                goto LAB_001672a7;
              }
              sVar4 = strlen(grpLocation3);
              (grpLocation3 + sVar4)[0] = '/';
              (grpLocation3 + sVar4)[1] = '\0';
              strcat(grpLocation3,grplc);
              iVar2 = fits_clean_url(grpLocation3,grplc,status);
              *status = iVar2;
            }
            iVar3 = strcmp(grplc,grpLocation1);
            if (iVar3 != 0) {
              iVar3 = strcmp(grplc,grpLocation2);
              uVar7 = 0;
              if (iVar3 == 0) goto LAB_00167320;
              goto LAB_001672a7;
            }
          }
          else {
            iVar2 = 0;
          }
LAB_00167320:
          uVar7 = (uint)uVar8;
          goto LAB_001672a7;
        }
        strcpy(grpLocation3,cwd);
        sVar4 = strlen(grpLocation3);
        sVar5 = strlen(grpLocation2);
        if (0xfffffffffffffbfe < (sVar5 + sVar4) - 0x400) {
          sVar4 = strlen(grpLocation3);
          (grpLocation3 + sVar4)[0] = '/';
          (grpLocation3 + sVar4)[1] = '\0';
          strcat(grpLocation3,grpLocation2);
          fits_clean_url(grpLocation3,grpLocation2,status);
          goto LAB_0016725f;
        }
      }
      else {
        strcpy(grpLocation3,cwd);
        sVar4 = strlen(grpLocation3);
        sVar5 = strlen(grpLocation1);
        if (0xfffffffffffffbfe < (sVar5 + sVar4) - 0x400) {
          sVar4 = strlen(grpLocation3);
          (grpLocation3 + sVar4)[0] = '/';
          (grpLocation3 + sVar4)[1] = '\0';
          strcat(grpLocation3,grpLocation1);
          fits_clean_url(grpLocation3,grpLocation1,status);
          goto LAB_00167087;
        }
      }
      ffpmsg("group locations are too long (ffgmrm)");
      *status = 0x7d;
      goto LAB_0016759b;
    }
LAB_00167588:
    iVar2 = ffdrow(gfptr,member,1,status);
  }
  else {
    if (rmopt != 2) {
      *status = 0x15b;
      ffpmsg("Invalid value specified for the rmopt parameter (ffgmrm)");
      goto LAB_0016759b;
    }
    iVar2 = ffghdn(mfptr,&hdutype);
    if (iVar2 == 1) {
      *status = 0x12d;
      goto LAB_0016759b;
    }
    iVar2 = ffgkys(mfptr,"EXTNAME",grpLocation1,card,status);
    *status = iVar2;
    if (iVar2 == 0xca) {
      grpLocation1[0] = '\0';
      *status = 0;
      iVar2 = 0;
    }
    prepare_keyvalue(grpLocation1);
    if (iVar2 != 0) goto LAB_0016759b;
    iVar2 = fits_strcasecmp(grpLocation1,"GROUPING");
    if (iVar2 == 0) {
      iVar2 = ffgtnm(mfptr,&nmembers,status);
      *status = iVar2;
      for (member_00 = nmembers; 0 < member_00; member_00 = member_00 + -1) {
        if (iVar2 != 0) goto LAB_0016759b;
        iVar2 = ffgmrm(mfptr,member_00,1,status);
        *status = iVar2;
      }
      if (iVar2 != 0) goto LAB_0016759b;
    }
    iVar2 = ffgmul(mfptr,0,status);
    *status = iVar2;
    if ((iVar2 != 0) || (ffrdef(gfptr,status), iomode == 0)) goto LAB_0016759b;
    iVar2 = ffdhdu(mfptr,&hdutype,status);
  }
  *status = iVar2;
LAB_0016759b:
  if (mfptr != (fitsfile *)0x0) {
    ffclos(mfptr,status);
  }
  return *status;
LAB_001674e0:
  iVar2 = 0;
  snprintf(card,0x51,"No GRPLC%d found for GRPID%d",uVar8 & 0xffffffff,uVar8 & 0xffffffff);
  ffpmsg(card);
  *status = 0;
  goto LAB_001672a4;
}

Assistant:

int ffgmrm(fitsfile *gfptr,  /* FITS file pointer to group table             */
	   long      member, /* member ID (row num) in the group             */
	   int       rmopt,  /* code specifying the delete option:
				OPT_RM_ENTRY ==> delete the member entry
				OPT_RM_MBR   ==> delete entry and member HDU */
	   int      *status)  /* return status code                          */

/*
  remove a member HDU from a grouping table. The fitsfile pointer gfptr must
  be positioned with the grouping table as the CHDU, and the member to 
  delete is identified by its row number in the table (first member == 1).
  The rmopt parameter determines if the member entry is deleted from the
  grouping table (in which case GRPIDn and GRPLCn keywords in the member 
  HDU's header shall be updated accordingly) or if the member HDU shall 
  itself be removed from its FITS file.
*/

{
  int found;
  int hdutype   = 0;
  int index;
  int iomode    = 0;

  long i;
  long ngroups      = 0;
  long nmembers     = 0;
  long groupExtver  = 0;
  long grpid        = 0;

  char grpLocation1[FLEN_FILENAME];
  char grpLocation2[FLEN_FILENAME];
  char grpLocation3[FLEN_FILENAME];
  char cwd[FLEN_FILENAME];
  char keyword[FLEN_KEYWORD];
  /* SPR 1738 This can now be longer */
  char grplc[FLEN_FILENAME];
  char *tgrplc;
  char keyvalue[FLEN_VALUE];
  char card[FLEN_CARD];
  char *editLocation;
  char mrootname[FLEN_FILENAME], grootname[FLEN_FILENAME];

  fitsfile *mfptr  = NULL;


  if(*status != 0) return(*status);

  do
    {
      /*
	make sure the grouping table can be modified before proceeding
      */

      fits_file_mode(gfptr,&iomode,status);

      if(iomode != READWRITE)
	{
	  ffpmsg("cannot modify grouping table (ffgtam)");
	  *status = BAD_GROUP_DETACH;
	  continue;
	}

      /* open the group member to be deleted and get its IOstatus*/

      *status = fits_open_member(gfptr,member,&mfptr,status);
      *status = fits_file_mode(mfptr,&iomode,status);

      /*
	 if the member HDU is to be deleted then call fits_unlink_member()
	 to remove it from all groups to which it belongs (including
	 this one) and then delete it. Note that if the member is a
	 grouping table then we have to recursively call fits_remove_member()
	 for each member of the member before we delete the member itself.
      */

      if(rmopt == OPT_RM_MBR)
	{
	    /* cannot delete a PHDU */
	    if(fits_get_hdu_num(mfptr,&hdutype) == 1)
		{
		    *status = BAD_HDU_NUM;
		    continue;
		}

	  /* determine if the member HDU is itself a grouping table */

	  *status = fits_read_key_str(mfptr,"EXTNAME",keyvalue,card,status);

	  /* if no EXTNAME is found then the HDU cannot be a grouping table */ 

	  if(*status == KEY_NO_EXIST) 
	    {
	      keyvalue[0] = 0;
	      *status = 0;
	    }
	  prepare_keyvalue(keyvalue);

	  /* Any other error is a reason to abort */

	  if(*status != 0) continue;

	  /* if the EXTNAME == GROUPING then the member is a grouping table */
	  
	  if(fits_strcasecmp(keyvalue,"GROUPING") == 0)
	    {
	      /* remove each of the grouping table members */
	      
	      *status = fits_get_num_members(mfptr,&nmembers,status);
	      
	      for(i = nmembers; i > 0 && *status == 0; --i)
		*status = fits_remove_member(mfptr,i,OPT_RM_ENTRY,status);
	      
	      if(*status != 0) continue;
	    }

	  /* unlink the member HDU from all groups that contain it */

	  *status = ffgmul(mfptr,0,status);

	  if(*status != 0) continue;
 
	  /* reset the grouping table HDU struct */

	  fits_set_hdustruc(gfptr,status);

	  /* delete the member HDU */

	  if(iomode != READONLY)
	    *status = fits_delete_hdu(mfptr,&hdutype,status);
	}
      else if(rmopt == OPT_RM_ENTRY)
	{
	  /* 
	     The member HDU is only to be removed as an entry from this
	     grouping table. Actions are (1) find the GRPIDn/GRPLCn 
	     keywords that link the member to the grouping table, (2)
	     remove the GRPIDn/GRPLCn keyword from the member HDU header
	     and (3) remove the member entry from the grouping table
	  */

	  /*
	    there is no need to seach for and remove the GRPIDn/GRPLCn
	    keywords from the member HDU if it has not been opened
	    in READWRITE mode
	  */

	  if(iomode == READWRITE)
	    {	  	      
	      /* 
		 determine the group EXTVER value of the grouping table; if
		 the member HDU and grouping table HDU do not reside in the 
		 same file then set the groupExtver value to its negative 
	      */
	      
	      *status = fits_read_key_lng(gfptr,"EXTVER",&groupExtver,card,
					  status);
	      /* Now, if either the Fptr values are the same, or the root filenames
	         are the same, then assume these refer to the same file.
	      */
	      fits_parse_rootname(mfptr->Fptr->filename, mrootname, status);
	      fits_parse_rootname(gfptr->Fptr->filename, grootname, status);

	      if((mfptr->Fptr != gfptr->Fptr) && 
	          strncmp(mrootname, grootname, FLEN_FILENAME))
                       groupExtver = -1*groupExtver;
	      
	      /*
		retrieve the URLs for the grouping table; note that it is 
		possible that the grouping table file has two URLs, the 
		one used to open it and the "real" one pointing to the 
		actual file being accessed
	      */
	      
	      *status = fits_get_url(gfptr,grpLocation1,grpLocation2,NULL,
				     NULL,NULL,status);
	      
	      if(*status != 0) continue;
	      
	      /*
		if either of the group location strings specify a relative
		file path then convert them into absolute file paths
	      */

	      *status = fits_get_cwd(cwd,status);
	      
	      if(*grpLocation1 != 0 && *grpLocation1 != '/' &&
		 !fits_is_url_absolute(grpLocation1))
		{
		  strcpy(grpLocation3,cwd);
                  if (strlen(grpLocation3)+strlen(grpLocation1)+1 > 
                            FLEN_FILENAME-1)
                  {
                     ffpmsg("group locations are too long (ffgmrm)");
                     *status = URL_PARSE_ERROR;
                     continue;
                  }
		  strcat(grpLocation3,"/");
		  strcat(grpLocation3,grpLocation1);
		  fits_clean_url(grpLocation3,grpLocation1,status);
		}
	      
	      if(*grpLocation2 != 0 && *grpLocation2 != '/' &&
		 !fits_is_url_absolute(grpLocation2))
		{
		  strcpy(grpLocation3,cwd);
                  if (strlen(grpLocation3)+strlen(grpLocation2)+1 > 
                            FLEN_FILENAME-1)
                  {
                     ffpmsg("group locations are too long (ffgmrm)");
                     *status = URL_PARSE_ERROR;
                     continue;
                  }
		  strcat(grpLocation3,"/");
		  strcat(grpLocation3,grpLocation2);
		  fits_clean_url(grpLocation3,grpLocation2,status);
		}
	      
	      /*
		determine the number of groups to which the member HDU 
		belongs
	      */
	      
	      *status = fits_get_num_groups(mfptr,&ngroups,status);
	      
	      /* reset the HDU keyword position counter to the beginning */
	      
	      *status = ffgrec(mfptr,0,card,status);
	      
	      /*
		loop over all the GRPIDn keywords in the member HDU header 
		and find the appropriate GRPIDn and GRPLCn keywords that 
		identify it as belonging to the group
	      */
	      
	      for(index = 1, found = 0; index <= ngroups && *status == 0 && 
		    !found; ++index)
		{	  
		  /* read the next GRPIDn keyword in the series */
		  
		  snprintf(keyword,FLEN_KEYWORD,"GRPID%d",index);
		  
		  *status = fits_read_key_lng(mfptr,keyword,&grpid,card,
					      status);
		  if(*status != 0) continue;
		  
		  /* 
		     grpid value == group EXTVER value then we could have a 
		     match
		  */
		  
		  if(grpid == groupExtver && grpid > 0)
		    {
		      /*
			if GRPID is positive then its a match because 
			both the member HDU and grouping table HDU reside
			in the same FITS file
		      */
		      
		      found = index;
		    }
		  else if(grpid == groupExtver && grpid < 0)
		    {
		      /* 
			 have to look at the GRPLCn value to determine a 
			 match because the member HDU and grouping table 
			 HDU reside in different FITS files
		      */
		      
		      snprintf(keyword,FLEN_KEYWORD,"GRPLC%d",index);
		      
		      /* SPR 1738 */
		      *status = fits_read_key_longstr(mfptr,keyword,&tgrplc,
						      card, status);
		      if (0 == *status) {
			strcpy(grplc,tgrplc);
			free(tgrplc);
		      }
		      		      
		      if(*status == KEY_NO_EXIST)
			{
			  /* 
			     no GRPLCn keyword value found ==> grouping
			     convention not followed; nothing we can do 
			     about it, so just continue
			  */
			  
			  snprintf(card,FLEN_CARD,"No GRPLC%d found for GRPID%d",
				  index,index);
			  ffpmsg(card);
			  *status = 0;
			  continue;
			}
		      else if (*status != 0) continue;
		      
		      /* construct the URL for the GRPLCn value */
		      
		      prepare_keyvalue(grplc);
		      
		      /*
			if the grplc value specifies a relative path then
			turn it into a absolute file path for comparison
			purposes
		      */
		      
		      if(*grplc != 0 && !fits_is_url_absolute(grplc) &&
			 *grplc != '/')
			{
			    /* No, wrong, 
			       strcpy(grpLocation3,cwd);
			       should be */
			    *status = fits_file_name(mfptr,grpLocation3,status);
			    /* Remove everything after the last / */
			    if (NULL != (editLocation = strrchr(grpLocation3,'/'))) {
				*editLocation = '\0';
			    }
				
                          if (strlen(grpLocation3)+strlen(grplc)+1 > 
                                    FLEN_FILENAME-1)
                          {
                             ffpmsg("group locations are too long (ffgmrm)");
                             *status = URL_PARSE_ERROR;
                             continue;
                          }
			  strcat(grpLocation3,"/");
			  strcat(grpLocation3,grplc);
			  *status = fits_clean_url(grpLocation3,grplc,
						   status);
			}
		      
		      /*
			if the absolute value of GRPIDn is equal to the
			EXTVER value of the grouping table and (one of the 
			possible two) grouping table file URL matches the
			GRPLCn keyword value then we hava a match
		      */
		      
		      if(strcmp(grplc,grpLocation1) == 0  || 
			 strcmp(grplc,grpLocation2) == 0) 
			found = index; 
		    }
		}

	      /*
		if found == 0 (false) after the above search then we assume 
		that it is due to an inpromper updating of the GRPIDn and 
		GRPLCn keywords in the member header ==> nothing to delete 
		in the header. Else delete the GRPLCn and GRPIDn keywords 
		that identify the member HDU with the group HDU and 
		re-enumerate the remaining GRPIDn and GRPLCn keywords
	      */

	      if(found != 0)
		{
		  snprintf(keyword,FLEN_KEYWORD,"GRPID%d",found);
		  *status = fits_delete_key(mfptr,keyword,status);
		  
		  snprintf(keyword,FLEN_KEYWORD,"GRPLC%d",found);
		  *status = fits_delete_key(mfptr,keyword,status);
		  
		  *status = 0;
		  
		  /* call fits_get_num_groups() to re-enumerate the GRPIDn */
		  
		  *status = fits_get_num_groups(mfptr,&ngroups,status);
		} 
	    }

	  /*
	     finally, remove the member entry from the current grouping table
	     pointed to by gfptr
	  */

	  *status = fits_delete_rows(gfptr,member,1,status);
	}
      else
	{
	  *status = BAD_OPTION;
	  ffpmsg("Invalid value specified for the rmopt parameter (ffgmrm)");
	}

    }while(0);

  if(mfptr != NULL) 
    {
      fits_close_file(mfptr,status);
    }

  return(*status);
}